

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_mesh.cpp
# Opt level: O2

bool dxil_spv::emit_dispatch_mesh_instruction(Impl *impl,CallInst *instruction)

{
  Id arg;
  Operation *op;
  Value *value;
  uint i;
  uint index;
  
  op = Converter::Impl::allocate(impl,OpEmitMeshTasksEXT);
  for (index = 1; index != 5; index = index + 1) {
    value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,index);
    arg = Converter::Impl::get_id_for_value(impl,value,0);
    Operation::add_id(op,arg);
  }
  Converter::Impl::add(impl,op,false);
  return true;
}

Assistant:

bool emit_dispatch_mesh_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	Operation *op = impl.allocate(spv::OpEmitMeshTasksEXT);

	for (unsigned i = 1; i <= 4; i++)
		op->add_id(impl.get_id_for_value(instruction->getOperand(i)));

	impl.add(op);
	return true;
}